

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness4Test::iterate
          (MultisampleTextureDependenciesFBOIncompleteness4Test *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  allocator<char> local_1c1;
  GLuint *local_1c0;
  GLint gl_max_samples_value;
  undefined1 local_1b0 [384];
  long lVar5;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  gl_max_samples_value = 0;
  (**(code **)(lVar5 + 0x868))(0x8d57,&gl_max_samples_value);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() generated an error for GL_MAX_SAMPLES pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x2fc);
  if (gl_max_samples_value < 3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"GL_MAX_SAMPLES pname value < 3, skipping",&local_1c1);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (bVar2) {
    (**(code **)(lVar5 + 0x6f8))(1,&this->to_id_2d_multisample_array_color);
  }
  (**(code **)(lVar5 + 0x6f8))(1,&this->to_id_2d_multisample_color);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"At least one glGenTextures() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x30b);
  (**(code **)(lVar5 + 0x6d0))(1,&this->fbo_id);
  (**(code **)(lVar5 + 0x78))(0x8ca9,this->fbo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up a framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x311);
  local_1c0 = &this->rbo_id;
  (**(code **)(lVar5 + 0x6e8))(1);
  (**(code **)(lVar5 + 0xa0))(0x8d41,this->rbo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up a renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x317);
  (**(code **)(lVar5 + 0xb8))(0x9100,this->to_id_2d_multisample_color);
  (**(code **)(lVar5 + 0x1390))(0x9100,2,0x8058,2,2,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up GL_RGBA8 multisample texture storage.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,800);
  if (bVar2) {
    (**(code **)(lVar5 + 0xb8))(0x9102,this->to_id_2d_multisample_array_color);
    (**(code **)(lVar5 + 0x13a8))(0x9102,2,0x8058,2,2,2,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not set up second GL_RGBA8 multisample texture storage.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x32c);
  }
  (**(code **)(lVar5 + 0x1240))(0x8d41,3,0x8058,2,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up renderbuffer storage.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x334);
  (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0x9100,this->to_id_2d_multisample_color,0);
  iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
  if (iVar3 == 0x8cd5) {
    if (bVar2) {
      (**(code **)(lVar5 + 0x6b8))(0x8ca9,0x8ce1,this->to_id_2d_multisample_array_color,0,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not set up FBO color attachments",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x34c);
      iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
      if (iVar3 != 0x8d56) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid FBO completeness status reported:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid FBO completeness status reported.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                   ,0x357);
        goto LAB_00c87b11;
      }
    }
    (**(code **)(lVar5 + 0x688))(0x8ca9,0x8ce2,0x8d41,*local_1c0);
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar3 == 0x8d56) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid FBO completeness status reported:");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x366);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid FBO completeness status reported:");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," expected: GL_FRAMEBUFFER_COMPLETE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x342);
  }
LAB_00c87b11:
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesFBOIncompleteness4Test::iterate()
{
	bool are_2d_ms_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if GL_MAX_SAMPLES pname value >= 3 */
	glw::GLint gl_max_samples_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() generated an error for GL_MAX_SAMPLES pname");

	if (gl_max_samples_value < 3)
	{
		throw tcu::NotSupportedError("GL_MAX_SAMPLES pname value < 3, skipping");
	}

	/* Set up texture objects */
	if (are_2d_ms_array_tos_supported)
	{
		gl.genTextures(1, &to_id_2d_multisample_array_color);
	}

	gl.genTextures(1, &to_id_2d_multisample_color);

	GLU_EXPECT_NO_ERROR(gl.getError(), "At least one glGenTextures() call failed");

	/* Set up a framebuffer object */
	gl.genFramebuffers(1, &fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a framebuffer object");

	/* Set up a renderbuffer object */
	gl.genRenderbuffers(1, &rbo_id);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a renderbuffer object");

	/* Set up first GL_RGBA8 multisample texture storage */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_2d_multisample_color);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 2,					 /* width */
							   2,							 /* height */
							   GL_FALSE);					 /* fixedsamplelocations */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up GL_RGBA8 multisample texture storage.");

	if (are_2d_ms_array_tos_supported)
	{
		/* Set up second GL_RGBA8 multisample texture storage */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_multisample_array_color);
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGBA8, 2,							   /* width */
								   2,									   /* height */
								   2,									   /* depth */
								   GL_TRUE);							   /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up second GL_RGBA8 multisample texture storage.");
	}

	/* Set up renderbuffer storage */
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 3, /* samples */
									  GL_RGBA8, 2,		  /* width */
									  2);				  /* height */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up renderbuffer storage.");

	/* Set up FBO's zeroth color attachment */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE,
							to_id_2d_multisample_color, 0); /* level */

	/* Make sure FBO is considered complete at this point */
	glw::GLenum fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid FBO completeness status reported:" << fbo_completeness
						   << " expected: GL_FRAMEBUFFER_COMPLETE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	if (are_2d_ms_array_tos_supported)
	{
		/* Set up FBO's first color attachment */
		gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to_id_2d_multisample_array_color,
								   0,  /* level */
								   0); /* layer */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up FBO color attachments");

		/* FBO should now be considered incomplete */
		fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		if (fbo_completeness != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid FBO completeness status reported:" << fbo_completeness
							   << " expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE" << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FBO completeness status reported.");
		}
	}

	/* Set up FBO's second color attachment */
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, GL_RENDERBUFFER, rbo_id);

	/* FBO should now be considered incomplete */
	fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_completeness != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid FBO completeness status reported:" << fbo_completeness
						   << " expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}